

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

void ucnv_shareConverterData(UConverterSharedData *data)

{
  UBool UVar1;
  uint16_t uVar2;
  UErrorCode local_14;
  UConverterSharedData *pUStack_10;
  UErrorCode err;
  UConverterSharedData *data_local;
  
  local_14 = U_ZERO_ERROR;
  pUStack_10 = data;
  if (SHARED_DATA_HASHTABLE == (UHashtable *)0x0) {
    uVar2 = ucnv_io_countKnownConverters_63(&local_14);
    SHARED_DATA_HASHTABLE =
         uhash_openSize_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                           (uint)uVar2 << 1,&local_14);
    ucnv_enableCleanup_63();
    UVar1 = U_FAILURE(local_14);
    if (UVar1 != '\0') {
      return;
    }
  }
  pUStack_10->sharedDataCached = '\x01';
  uhash_put_63(SHARED_DATA_HASHTABLE,pUStack_10->staticData->name,pUStack_10,&local_14);
  return;
}

Assistant:

static void
ucnv_shareConverterData(UConverterSharedData * data)
{
    UErrorCode err = U_ZERO_ERROR;
    /*Lazy evaluates the Hashtable itself */
    /*void *sanity = NULL;*/

    if (SHARED_DATA_HASHTABLE == NULL)
    {
        SHARED_DATA_HASHTABLE = uhash_openSize(uhash_hashChars, uhash_compareChars, NULL,
                            ucnv_io_countKnownConverters(&err)*UCNV_CACHE_LOAD_FACTOR,
                            &err);
        ucnv_enableCleanup();

        if (U_FAILURE(err))
            return;
    }

    /* ### check to see if the element is not already there! */

    /*
    sanity =   ucnv_getSharedConverterData (data->staticData->name);
    if(sanity != NULL)
    {
    UCNV_DEBUG_LOG("put:overwrite!",data->staticData->name,sanity);
    }
    UCNV_DEBUG_LOG("put:chk",data->staticData->name,sanity);
    */

    /* Mark it shared */
    data->sharedDataCached = TRUE;

    uhash_put(SHARED_DATA_HASHTABLE,
            (void*) data->staticData->name, /* Okay to cast away const as long as
            keyDeleter == NULL */
            data,
            &err);
    UCNV_DEBUG_LOG("put", data->staticData->name,data);

}